

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_player_prop_code(parser *p)

{
  char *__s1;
  int iVar1;
  int iVar2;
  parser_error pVar3;
  char *code;
  void *pvVar4;
  char **code_name;
  
  code = parser_getstr(p,"code");
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    return PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  __s1 = *(char **)((long)pvVar4 + 0x10);
  if (__s1 == (char *)0x0) {
    return PARSE_ERROR_MISSING_PLAY_PROP_TYPE;
  }
  iVar1 = strcmp(__s1,"player");
  if (iVar1 == 0) {
    code_name = player_info_flags;
  }
  else {
    iVar1 = strcmp(__s1,"object");
    iVar2 = -1;
    if (iVar1 != 0) goto LAB_0015ddbf;
    code_name = list_obj_flag_names;
  }
  iVar2 = code_index_in_array(code_name,code);
LAB_0015ddbf:
  if (iVar2 < 0) {
    pVar3 = PARSE_ERROR_INVALID_PLAY_PROP_CODE;
  }
  else {
    *(short *)((long)pvVar4 + 8) = (short)iVar2;
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_player_prop_code(struct parser *p) {
	const char *code = parser_getstr(p, "code");
	struct embryo_player_ability *embryo = parser_priv(p);
	int index = -1;

	if (!embryo)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (!embryo->ability.type)
		return PARSE_ERROR_MISSING_PLAY_PROP_TYPE;

	if (streq(embryo->ability.type, "player")) {
		index = code_index_in_array(player_info_flags, code);
	} else if (streq(embryo->ability.type, "object")) {
		index = code_index_in_array(list_obj_flag_names, code);
	}
	if (index >= 0) {
		embryo->ability.index = index;
	} else {
		return PARSE_ERROR_INVALID_PLAY_PROP_CODE;
	}
	return PARSE_ERROR_NONE;
}